

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O3

void __thiscall
IRBuilderAsmJs::BuildSimd_2Int2
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot src1RegSlot,RegSlot src2RegSlot,RegSlot src3RegSlot,IRType simdType,IRType valType
          )

{
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  ValueType valueType;
  ValueType VVar4;
  OpCode opcode;
  RegOpnd *pRVar5;
  RegOpnd *src1;
  RegOpnd *src1_00;
  RegOpnd *this_00;
  Instr *pIVar6;
  undefined4 *puVar7;
  
  valueType = GetSimdValueTypeFromIRType(this,simdType);
  pRVar5 = BuildSrcOpnd(this,src1RegSlot,simdType);
  IR::Opnd::SetValueType(&pRVar5->super_Opnd,valueType);
  src1 = BuildSrcOpnd(this,src2RegSlot,TyInt32);
  VVar4 = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&src1->super_Opnd,VVar4);
  src1_00 = BuildSrcOpnd(this,src3RegSlot,valType);
  VVar4 = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&src1_00->super_Opnd,VVar4);
  this_00 = BuildDstOpnd(this,dstRegSlot,simdType);
  IR::Opnd::SetValueType(&this_00->super_Opnd,valueType);
  pIVar6 = AddExtendedArg(this,pRVar5,(RegOpnd *)0x0,offset);
  pRVar5 = (RegOpnd *)pIVar6->m_dst;
  OVar2 = IR::Opnd::GetKind((Opnd *)pRVar5);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_004ff1a3;
    *puVar7 = 0;
  }
  pIVar6 = AddExtendedArg(this,src1,pRVar5,offset);
  pRVar5 = (RegOpnd *)pIVar6->m_dst;
  OVar2 = IR::Opnd::GetKind((Opnd *)pRVar5);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) {
LAB_004ff1a3:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar7 = 0;
  }
  pIVar6 = AddExtendedArg(this,src1_00,pRVar5,offset);
  opcode = GetSimdOpcode(this,newOpcode);
  pIVar6 = IR::Instr::New(opcode,&this_00->super_Opnd,pIVar6->m_dst,this->m_func);
  AddInstr(this,pIVar6,offset);
  return;
}

Assistant:

void IRBuilderAsmJs::BuildSimd_2Int2(Js::OpCodeAsmJs newOpcode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot src1RegSlot, Js::RegSlot src2RegSlot, Js::RegSlot src3RegSlot, IRType simdType, IRType valType)
{
    ValueType valueType = GetSimdValueTypeFromIRType(simdType);

    IR::RegOpnd * src1Opnd = BuildSrcOpnd(src1RegSlot, simdType);
    src1Opnd->SetValueType(valueType);

    IR::RegOpnd * src2Opnd = BuildSrcOpnd(src2RegSlot, TyInt32);
    src2Opnd->SetValueType(ValueType::GetInt(false));

    IR::RegOpnd * src3Opnd = BuildSrcOpnd(src3RegSlot, valType);
    src3Opnd->SetValueType(ValueType::GetInt(false));

    IR::RegOpnd * dstOpnd = BuildDstOpnd(dstRegSlot, simdType);
    dstOpnd->SetValueType(valueType);

    // Given bytecode: dst = op s1, s2, s3
    // Generate:
    // t1 = ExtendedArg_A s1
    // t2 = ExtendedArg_A s2, t1
    // t3 = ExtendedArg_A s3, t2
    // dst = op t3

    IR::Instr* instr = nullptr;

    instr = AddExtendedArg(src1Opnd, nullptr, offset);
    instr = AddExtendedArg(src2Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(src3Opnd, instr->GetDst()->AsRegOpnd(), offset);

    Js::OpCode opcode = GetSimdOpcode(newOpcode);
    AddInstr(IR::Instr::New(opcode, dstOpnd, instr->GetDst(), m_func), offset);
}